

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
GetFloatPixels(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
              Point2i res,int nc)

{
  int iVar1;
  memory_resource *pmVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int c;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  float local_58;
  float local_54;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pmVar2 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->alloc).memoryResource = pmVar2;
  uVar8 = res.super_Tuple2<pbrt::Point2,_int>.y;
  uVar7 = res.super_Tuple2<pbrt::Point2,_int>.x;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  local_40 = (double)(int)(uVar8 * uVar7);
  iVar1 = 0;
  for (uVar4 = 0; uVar4 != (~((int)uVar8 >> 0x1f) & uVar8); uVar4 = uVar4 + 1) {
    local_50 = (double)(int)uVar4 * 0.125;
    iVar5 = iVar1;
    for (uVar3 = 0; uVar3 != (~((int)uVar7 >> 0x1f) & uVar7); uVar3 = uVar3 + 1) {
      local_48 = (double)(int)uVar3 * 0.25;
      for (uVar6 = 0; (~(nc >> 0x1f) & nc) != uVar6; uVar6 = uVar6 + 1) {
        if (uVar6 == 0) {
          local_38 = sin(local_48);
          dVar9 = cos(local_50);
          local_54 = (float)(dVar9 * local_38);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                    (__return_storage_ptr__,&local_54);
        }
        else {
          local_58 = (float)(((double)(int)(iVar5 + uVar6) + (double)(int)(iVar5 + uVar6)) /
                             local_40 + -0.25);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                    (__return_storage_ptr__,&local_58);
        }
      }
      iVar5 = iVar5 + 3;
    }
    iVar1 = iVar1 + uVar7 * 3;
  }
  return __return_storage_ptr__;
}

Assistant:

static pstd::vector<float> GetFloatPixels(Point2i res, int nc) {
    pstd::vector<float> p;
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < nc; ++c)
                if (c == 0)
                    p.push_back(std::sin(x / 4.) * std::cos(y / 8.));
                else
                    p.push_back(-.25 +
                                2. * (c + 3 * x + 3 * y * res[0]) / (res[0] * res[1]));
    return p;
}